

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<signed_char_const&>::
captureExpression<(Catch::Internal::Operator)1,tcb::rational<signed_char>>
          (ExpressionLhs<signed_char_const&> *this,rational<signed_char> *rhs)

{
  ResultBuilder *pRVar1;
  char value;
  rational<signed_char> *_value;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  pRVar1 = ResultBuilder::setResultType
                     (*(ResultBuilder **)this,
                      rhs->denom_ != '\x01' || **(char **)(this + 8) != rhs->num_);
  Catch::toString_abi_cxx11_(&local_38,(Catch *)(ulong)(uint)(int)**(char **)(this + 8),value);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  Detail::StringMakerBase<true>::convert<tcb::rational<signed_char>>
            (&local_58,(StringMakerBase<true> *)rhs,_value);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_58);
  std::__cxx11::string::string((string *)&local_78,"!=",&local_79);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }